

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3DbMallocRawNN(sqlite3 *db,u64 n)

{
  undefined8 *puVar1;
  void *pvVar2;
  ulong in_RSI;
  long in_RDI;
  LookasideSlot *pBuf;
  u64 in_stack_ffffffffffffffd8;
  undefined8 *local_8;
  
  if (*(ushort *)(in_RDI + 0x19c) < in_RSI) {
    if (*(int *)(in_RDI + 0x198) == 0) {
      *(int *)(in_RDI + 0x1ac) = *(int *)(in_RDI + 0x1ac) + 1;
    }
    else if (*(char *)(in_RDI + 0x67) != '\0') {
      return (void *)0x0;
    }
    pvVar2 = dbMallocRawFinish((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffd8);
    return pvVar2;
  }
  if (in_RSI < 0x81) {
    puVar1 = *(undefined8 **)(in_RDI + 0x1d0);
    if (puVar1 != (undefined8 *)0x0) {
      *(undefined8 *)(in_RDI + 0x1d0) = *puVar1;
      *(int *)(in_RDI + 0x1a8) = *(int *)(in_RDI + 0x1a8) + 1;
      return puVar1;
    }
    puVar1 = *(undefined8 **)(in_RDI + 0x1c8);
    if (puVar1 != (undefined8 *)0x0) {
      *(undefined8 *)(in_RDI + 0x1c8) = *puVar1;
      *(int *)(in_RDI + 0x1a8) = *(int *)(in_RDI + 0x1a8) + 1;
      return puVar1;
    }
  }
  local_8 = *(undefined8 **)(in_RDI + 0x1c0);
  if (local_8 == (undefined8 *)0x0) {
    local_8 = *(undefined8 **)(in_RDI + 0x1b8);
    if (local_8 == (undefined8 *)0x0) {
      *(int *)(in_RDI + 0x1b0) = *(int *)(in_RDI + 0x1b0) + 1;
      local_8 = (undefined8 *)dbMallocRawFinish((sqlite3 *)0x0,in_stack_ffffffffffffffd8);
    }
    else {
      *(undefined8 *)(in_RDI + 0x1b8) = *local_8;
      *(int *)(in_RDI + 0x1a8) = *(int *)(in_RDI + 0x1a8) + 1;
    }
  }
  else {
    *(undefined8 *)(in_RDI + 0x1c0) = *local_8;
    *(int *)(in_RDI + 0x1a8) = *(int *)(in_RDI + 0x1a8) + 1;
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbMallocRawNN(sqlite3 *db, u64 n){
#ifndef SQLITE_OMIT_LOOKASIDE
  LookasideSlot *pBuf;
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( n>db->lookaside.sz ){
    if( !db->lookaside.bDisable ){
      db->lookaside.anStat[1]++;
    }else if( db->mallocFailed ){
      return 0;
    }
    return dbMallocRawFinish(db, n);
  }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  if( n<=LOOKASIDE_SMALL ){
    if( (pBuf = db->lookaside.pSmallFree)!=0 ){
      db->lookaside.pSmallFree = pBuf->pNext;
      db->lookaside.anStat[0]++;
      return (void*)pBuf;
    }else if( (pBuf = db->lookaside.pSmallInit)!=0 ){
      db->lookaside.pSmallInit = pBuf->pNext;
      db->lookaside.anStat[0]++;
      return (void*)pBuf;
    }
  }
#endif
  if( (pBuf = db->lookaside.pFree)!=0 ){
    db->lookaside.pFree = pBuf->pNext;
    db->lookaside.anStat[0]++;
    return (void*)pBuf;
  }else if( (pBuf = db->lookaside.pInit)!=0 ){
    db->lookaside.pInit = pBuf->pNext;
    db->lookaside.anStat[0]++;
    return (void*)pBuf;
  }else{
    db->lookaside.anStat[2]++;
  }
#else
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( db->mallocFailed ){
    return 0;
  }
#endif
  return dbMallocRawFinish(db, n);
}